

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_join_ti_impl.h
# Opt level: O3

void __thiscall
join::
TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::TJoinTI(TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
          *this)

{
  _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_80;
  vector<label::StringLabel,_std::allocator<label::StringLabel>_> local_48;
  int local_30;
  vector<label::StringLabel,_std::allocator<label::StringLabel>_> local_28;
  
  (this->ld_).label_to_id_dictionary_._M_h._M_buckets =
       &(this->ld_).label_to_id_dictionary_._M_h._M_single_bucket;
  (this->ld_).label_to_id_dictionary_._M_h._M_bucket_count = 1;
  (this->ld_).label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ld_).label_to_id_dictionary_._M_h._M_element_count = 0;
  (this->ld_).label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ld_).label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ld_).label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ld_).id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ld_).id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->ld_).id_to_label_dictionary_.
           super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->ld_).id_to_label_dictionary_.
           super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_80._M_buckets = &local_80._M_single_bucket;
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_30 = 0;
  std::
  _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign((_Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_80);
  local_28.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->ld_).id_to_label_dictionary_.
       super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->ld_).id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_48.
                         super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         local_48.
                         super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
  local_28.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->ld_).id_to_label_dictionary_.
       super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->ld_).id_to_label_dictionary_.
       super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->ld_).id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->ld_).id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_48.
                         super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         local_48.
                         super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_);
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_48.super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::~vector(&local_28);
  (this->ld_).labels_count_ = local_30;
  std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::~vector(&local_48);
  std::
  _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_80);
  this->sum_subproblem_counter_ = 0;
  this->il_lookups_ = 0;
  this->number_of_labels_ = 0;
  this->pre_candidates_ = 0;
  return;
}

Assistant:

TJoinTI<Label, VerificationAlgorithm>::TJoinTI() {
  ld_ = label::LabelDictionary<Label>();
  pre_candidates_ = 0;
  sum_subproblem_counter_ = 0;
  number_of_labels_ = 0;
  il_lookups_ = 0;
}